

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_options<char>::basic_json_options(basic_json_options<char> *this)

{
  basic_json_decode_options<char> *in_RDI;
  basic_json_encode_options<char> *unaff_retaddr;
  void **in_stack_ffffffffffffffd8;
  basic_json_decode_options<char> *vtt;
  
  vtt = in_RDI;
  basic_json_options_common<char>::basic_json_options_common
            ((basic_json_options_common<char> *)in_RDI);
  basic_json_decode_options<char>::basic_json_decode_options(in_RDI,in_stack_ffffffffffffffd8);
  basic_json_encode_options<char>::basic_json_encode_options
            (unaff_retaddr,&vtt->_vptr_basic_json_decode_options);
  in_RDI->_vptr_basic_json_decode_options = (_func_int **)0x13335b8;
  *(undefined8 *)&in_RDI->field_0x70 = 0x1333608;
  *(undefined8 *)&in_RDI->field_0x30 = 0x13335e0;
  return;
}

Assistant:

basic_json_options() = default;